

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_compression.cpp
# Opt level: O1

void compress_triangles_lz4(char *filename)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  ostream *poVar6;
  uint uVar7;
  uint uVar8;
  ulong __size;
  uint32_t nr_of_triangles;
  uint8_t *b4;
  uint8_t *b3;
  uint8_t *b2;
  uint8_t *b1;
  uint32_t *triangles;
  float *vertices;
  uint32_t nr_of_vertices;
  LZ4_stream_t lz4Stream_body;
  uint local_4090;
  int local_408c;
  uint8_t *local_4088;
  uint8_t *local_4080;
  uint8_t *local_4078;
  uint8_t *local_4070;
  uint32_t *local_4068;
  float *local_4060;
  uint32_t local_4054;
  undefined1 local_4050 [16416];
  
  iVar2 = trico_read_stl(&local_4054,&local_4060,&local_4090,&local_4068,filename);
  TestEq<int,int>(1,iVar2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico.tests/int_compression.cpp"
                  ,0x52,"void compress_triangles_lz4(const char *)");
  uVar1 = local_4090 * 3;
  __size = (ulong)uVar1;
  local_4070 = (uint8_t *)malloc(__size);
  local_4078 = (uint8_t *)malloc(__size);
  local_4080 = (uint8_t *)malloc(__size);
  local_4088 = (uint8_t *)malloc(__size);
  trico_transpose_uint32_aos_to_soa
            (&local_4070,&local_4078,&local_4080,&local_4088,local_4068,uVar1);
  LZ4_initStream(local_4050,0x4020);
  uVar1 = local_4090 * 3;
  uVar7 = 0;
  uVar8 = 0;
  if (uVar1 < 0x7e000001) {
    uVar8 = (uint)((ulong)uVar1 * 0x8080808081 >> 0x27) + 0x10;
  }
  pcVar5 = (char *)operator_new__((ulong)uVar8);
  iVar2 = LZ4_compress_default((char *)local_4070,pcVar5,uVar1,uVar8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Compression ratio lz4 for b1: ",0x1e);
  local_408c = iVar2;
  poVar6 = std::ostream::_M_insert<double>((double)(((float)local_4090 * 3.0) / (float)iVar2));
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  operator_delete__(pcVar5);
  LZ4_initStream(local_4050,0x4020);
  uVar1 = local_4090 * 3;
  if (uVar1 < 0x7e000001) {
    uVar7 = (uint)((ulong)uVar1 * 0x8080808081 >> 0x27) + 0x10;
  }
  pcVar5 = (char *)operator_new__((ulong)uVar7);
  iVar2 = LZ4_compress_default((char *)local_4078,pcVar5,uVar1,uVar7);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Compression ratio lz4 for b2: ",0x1e);
  poVar6 = std::ostream::_M_insert<double>((double)(((float)local_4090 * 3.0) / (float)iVar2));
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  operator_delete__(pcVar5);
  LZ4_initStream(local_4050,0x4020);
  uVar1 = local_4090 * 3;
  uVar8 = 0;
  uVar7 = 0;
  if (uVar1 < 0x7e000001) {
    uVar7 = (uint)((ulong)uVar1 * 0x8080808081 >> 0x27) + 0x10;
  }
  pcVar5 = (char *)operator_new__((ulong)uVar7);
  iVar3 = LZ4_compress_default((char *)local_4080,pcVar5,uVar1,uVar7);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Compression ratio lz4 for b3: ",0x1e);
  poVar6 = std::ostream::_M_insert<double>((double)(((float)local_4090 * 3.0) / (float)iVar3));
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  operator_delete__(pcVar5);
  LZ4_initStream(local_4050,0x4020);
  uVar1 = local_4090 * 3;
  if (uVar1 < 0x7e000001) {
    uVar8 = (uint)((ulong)uVar1 * 0x8080808081 >> 0x27) + 0x10;
  }
  pcVar5 = (char *)operator_new__((ulong)uVar8);
  iVar4 = LZ4_compress_default((char *)local_4088,pcVar5,uVar1,uVar8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Compression ratio lz4 for b4: ",0x1e);
  poVar6 = std::ostream::_M_insert<double>((double)(((float)local_4090 * 3.0) / (float)iVar4));
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  operator_delete__(pcVar5);
  iVar2 = iVar2 + local_408c;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Compression ratio lz4 total: ",0x1d);
  poVar6 = std::ostream::_M_insert<double>
                     ((double)(((float)local_4090 * 12.0) / (float)(uint)(iVar3 + iVar4 + iVar2)));
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  free(local_4070);
  free(local_4078);
  free(local_4080);
  free(local_4088);
  free(local_4060);
  free(local_4068);
  return;
}

Assistant:

void compress_triangles_lz4(const char* filename)
  {
  uint32_t nr_of_vertices;
  float* vertices;
  uint32_t nr_of_triangles;
  uint32_t* triangles;

  TEST_EQ(1, trico_read_stl(&nr_of_vertices, &vertices, &nr_of_triangles, &triangles, filename));

  uint8_t* b1 = (uint8_t*)trico_malloc(nr_of_triangles * 3);
  uint8_t* b2 = (uint8_t*)trico_malloc(nr_of_triangles * 3);
  uint8_t* b3 = (uint8_t*)trico_malloc(nr_of_triangles * 3);
  uint8_t* b4 = (uint8_t*)trico_malloc(nr_of_triangles * 3);

  trico_transpose_uint32_aos_to_soa(&b1, &b2, &b3, &b4, triangles, nr_of_triangles * 3);

  uint32_t total_length = 0;
  {
  LZ4_stream_t lz4Stream_body;
  LZ4_stream_t* lz4Stream = &lz4Stream_body;
  LZ4_initStream(lz4Stream, sizeof(*lz4Stream));

  auto estimateLen = LZ4_COMPRESSBOUND(nr_of_triangles * 3);
  uint8_t* compressed_buf = new uint8_t[estimateLen];

  int bytes_written = LZ4_compress_default((const char*)b1, (char*)compressed_buf, (int)nr_of_triangles * 3, (int)estimateLen);
  total_length += bytes_written;
  std::cout << "Compression ratio lz4 for b1: " << ((float)nr_of_triangles * 3) / (float)bytes_written << "\n";

  delete[] compressed_buf;
  }
  {
  LZ4_stream_t lz4Stream_body;
  LZ4_stream_t* lz4Stream = &lz4Stream_body;
  LZ4_initStream(lz4Stream, sizeof(*lz4Stream));

  auto estimateLen = LZ4_COMPRESSBOUND(nr_of_triangles * 3);
  uint8_t* compressed_buf = new uint8_t[estimateLen];

  int bytes_written = LZ4_compress_default((const char*)b2, (char*)compressed_buf, (int)nr_of_triangles * 3, (int)estimateLen);
  total_length += bytes_written;
  std::cout << "Compression ratio lz4 for b2: " << ((float)nr_of_triangles * 3) / (float)bytes_written << "\n";

  delete[] compressed_buf;
  }
  {
  LZ4_stream_t lz4Stream_body;
  LZ4_stream_t* lz4Stream = &lz4Stream_body;
  LZ4_initStream(lz4Stream, sizeof(*lz4Stream));

  auto estimateLen = LZ4_COMPRESSBOUND(nr_of_triangles * 3);
  uint8_t* compressed_buf = new uint8_t[estimateLen];

  int bytes_written = LZ4_compress_default((const char*)b3, (char*)compressed_buf, (int)nr_of_triangles * 3, (int)estimateLen);
  total_length += bytes_written;
  std::cout << "Compression ratio lz4 for b3: " << ((float)nr_of_triangles * 3) / (float)bytes_written << "\n";

  delete[] compressed_buf;
  }
  {
  LZ4_stream_t lz4Stream_body;
  LZ4_stream_t* lz4Stream = &lz4Stream_body;
  LZ4_initStream(lz4Stream, sizeof(*lz4Stream));

  auto estimateLen = LZ4_COMPRESSBOUND(nr_of_triangles * 3);
  uint8_t* compressed_buf = new uint8_t[estimateLen];

  int bytes_written = LZ4_compress_default((const char*)b4, (char*)compressed_buf, (int)nr_of_triangles * 3, (int)estimateLen);
  total_length += bytes_written;
  std::cout << "Compression ratio lz4 for b4: " << ((float)nr_of_triangles * 3) / (float)bytes_written << "\n";

  delete[] compressed_buf;
  }

  std::cout << "Compression ratio lz4 total: " << ((float)nr_of_triangles*12.f) / (float)total_length << "\n";


  trico_free(b1);
  trico_free(b2);
  trico_free(b3);
  trico_free(b4);
  trico_free(vertices);
  trico_free(triangles);
  }